

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O2

bool __thiscall
cmRuntimeDependencyArchive::IsPreExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  bool bVar1;
  anon_class_8_1_60cb577c regexSearch;
  anon_class_40_2_f7e7401d_for__M_pred regexMatch;
  RegularExpressionMatch match;
  anon_class_8_1_60cb577c local_100;
  undefined1 local_f8 [40];
  undefined1 local_d0 [168];
  
  memset(local_d0,0,0xa8);
  local_f8._0_8_ = local_d0;
  std::__cxx11::string::string((string *)(local_f8 + 8),(string *)name);
  local_100.regexMatch = (anon_class_40_2_f7e7401d_for__M_pred *)local_f8;
  bVar1 = IsPreExcluded::anon_class_8_1_60cb577c::operator()(&local_100,&this->PreIncludeRegexes);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = IsPreExcluded::anon_class_8_1_60cb577c::operator()(&local_100,&this->PreExcludeRegexes);
  }
  std::__cxx11::string::~string((string *)(local_f8 + 8));
  return bVar1;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPreExcluded(const std::string& name) const
{
  cmsys::RegularExpressionMatch match;
  auto const regexMatch =
    [&match, name](const cmsys::RegularExpression& regex) -> bool {
    return regex.find(name.c_str(), match);
  };
  auto const regexSearch =
    [&regexMatch](
      const std::vector<cmsys::RegularExpression>& regexes) -> bool {
    return std::any_of(regexes.begin(), regexes.end(), regexMatch);
  };

  return !regexSearch(this->PreIncludeRegexes) &&
    regexSearch(this->PreExcludeRegexes);
}